

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O0

Aig_Man_t *
Ssw_SignalCorrespondenceWithPairs
          (Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vIds1,Vec_Int_t *vIds2,Ssw_Pars_t *pPars)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vPairs_00;
  Vec_Int_t **pvClasses_00;
  Ssw_Man_t *p_00;
  Ssw_Cla_t *pSVar3;
  Ssw_Sml_t *pSVar4;
  Aig_Man_t *pAVar5;
  Vec_Int_t **pvClasses;
  Vec_Int_t *vPairs;
  Ssw_Pars_t Pars;
  Aig_Man_t *pMiter;
  Aig_Man_t *pAigNew;
  Ssw_Man_t *p;
  Ssw_Pars_t *pPars_local;
  Vec_Int_t *vIds2_local;
  Vec_Int_t *vIds1_local;
  Aig_Man_t *pAig2_local;
  Aig_Man_t *pAig1_local;
  
  iVar1 = Vec_IntSize(vIds1);
  iVar2 = Vec_IntSize(vIds2);
  if (iVar1 == iVar2) {
    Pars.pFunc = Saig_ManCreateMiter(pAig1,pAig2,0);
    Aig_ManCleanup((Aig_Man_t *)Pars.pFunc);
    vPairs_00 = Ssw_TransferSignalPairs((Aig_Man_t *)Pars.pFunc,pAig1,pAig2,vIds1,vIds2);
    iVar1 = Aig_ManObjNumMax((Aig_Man_t *)Pars.pFunc);
    pvClasses_00 = Ssw_TransformPairsIntoTempClasses(vPairs_00,iVar1);
    Vec_IntFree(vPairs_00);
    p = (Ssw_Man_t *)pPars;
    if (pPars == (Ssw_Pars_t *)0x0) {
      p = (Ssw_Man_t *)&vPairs;
      Ssw_ManSetDefaultParams((Ssw_Pars_t *)&vPairs);
    }
    p_00 = Ssw_ManCreate((Aig_Man_t *)Pars.pFunc,(Ssw_Pars_t *)p);
    pSVar3 = Ssw_ClassesPreparePairs((Aig_Man_t *)Pars.pFunc,pvClasses_00);
    p_00->ppClasses = pSVar3;
    pSVar4 = Ssw_SmlStart((Aig_Man_t *)Pars.pFunc,0,p_00->nFrames + p_00->pPars->nFramesAddSim,1);
    p_00->pSml = pSVar4;
    Ssw_ClassesSetData(p_00->ppClasses,p_00->pSml,Ssw_SmlObjHashWord,Ssw_SmlObjIsConstWord,
                       Ssw_SmlObjsAreEqualWord);
    pAVar5 = Ssw_SignalCorrespondenceRefine(p_00);
    iVar1 = Aig_ManObjNumMax((Aig_Man_t *)Pars.pFunc);
    Ssw_FreeTempClasses(pvClasses_00,iVar1);
    Ssw_ManStop(p_00);
    Aig_ManStop((Aig_Man_t *)Pars.pFunc);
    return pAVar5;
  }
  __assert_fail("Vec_IntSize(vIds1) == Vec_IntSize(vIds2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswPairs.c"
                ,0x117,
                "Aig_Man_t *Ssw_SignalCorrespondenceWithPairs(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Ssw_Pars_t *)"
               );
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondenceWithPairs( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vIds1, Vec_Int_t * vIds2, Ssw_Pars_t * pPars )
{
    Ssw_Man_t * p;
    Aig_Man_t * pAigNew, * pMiter;
    Ssw_Pars_t Pars;
    Vec_Int_t * vPairs;
    Vec_Int_t ** pvClasses;
    assert( Vec_IntSize(vIds1) == Vec_IntSize(vIds2) );
    // create sequential miter
    pMiter = Saig_ManCreateMiter( pAig1, pAig2, 0 );
    Aig_ManCleanup( pMiter );
    // transfer information to the miter
    vPairs = Ssw_TransferSignalPairs( pMiter, pAig1, pAig2, vIds1, vIds2 );
    // create representation of the classes
    pvClasses = Ssw_TransformPairsIntoTempClasses( vPairs, Aig_ManObjNumMax(pMiter) );
    Vec_IntFree( vPairs );
    // if parameters are not given, create them
    if ( pPars == NULL )
        Ssw_ManSetDefaultParams( pPars = &Pars );
    // start the induction manager
    p = Ssw_ManCreate( pMiter, pPars );
    // create equivalence classes using these IDs
    p->ppClasses = Ssw_ClassesPreparePairs( pMiter, pvClasses );
    p->pSml = Ssw_SmlStart( pMiter, 0, p->nFrames + p->pPars->nFramesAddSim, 1 );
    Ssw_ClassesSetData( p->ppClasses, p->pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );
    // perform refinement of classes
    pAigNew = Ssw_SignalCorrespondenceRefine( p );
    // cleanup
    Ssw_FreeTempClasses( pvClasses, Aig_ManObjNumMax(pMiter) );
    Ssw_ManStop( p );
    Aig_ManStop( pMiter );
    return pAigNew;
}